

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

ConvertMnemonicToSeedResponseStruct *
cfd::js::api::HDWalletStructApi::ConvertMnemonicToSeed
          (ConvertMnemonicToSeedResponseStruct *__return_storage_ptr__,
          ConvertMnemonicToSeedRequestStruct *request)

{
  string *in_R8;
  allocator local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&)>
  local_118;
  ConvertMnemonicToSeedResponseStruct local_f8;
  
  ConvertMnemonicToSeedResponseStruct::ConvertMnemonicToSeedResponseStruct(__return_storage_ptr__);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:63:20)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:63:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_118,"ConvertMnemonicToSeed",&local_139);
  ExecuteStructApi<cfd::js::api::ConvertMnemonicToSeedRequestStruct,cfd::js::api::ConvertMnemonicToSeedResponseStruct>
            (&local_f8,(api *)request,(ConvertMnemonicToSeedRequestStruct *)&local_138,&local_118,
             in_R8);
  ConvertMnemonicToSeedResponseStruct::operator=(__return_storage_ptr__,&local_f8);
  ConvertMnemonicToSeedResponseStruct::~ConvertMnemonicToSeedResponseStruct(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

ConvertMnemonicToSeedResponseStruct HDWalletStructApi::ConvertMnemonicToSeed(
    const ConvertMnemonicToSeedRequestStruct& request) {
  auto call_func = [](const ConvertMnemonicToSeedRequestStruct& request)
      -> ConvertMnemonicToSeedResponseStruct {
    ConvertMnemonicToSeedResponseStruct response;
    // check language is support
    std::vector<std::string> mnemonic = request.mnemonic;
    std::string passphrase = request.passphrase;
    bool strict_check = request.strict_check;
    std::string language = request.language;
    bool use_ideographic_space =
        ((language == "jp") && request.use_ideographic_space);
    ByteData entropy;

    // get bip39 wordlist
    HDWalletApi api;
    ByteData seed = api.ConvertMnemonicToSeed(
        mnemonic, passphrase, strict_check, language, use_ideographic_space,
        &entropy);
    if (entropy.Empty()) {
      response.ignore_items.insert("entropy");
    } else {
      response.entropy = entropy.GetHex();
    }

    response.seed = seed.GetHex();
    return response;
  };

  ConvertMnemonicToSeedResponseStruct result;
  result = ExecuteStructApi<
      ConvertMnemonicToSeedRequestStruct, ConvertMnemonicToSeedResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}